

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

ALLEGRO_BITMAP * al_clone_bitmap(ALLEGRO_BITMAP *bitmap)

{
  _Bool _Var1;
  ALLEGRO_BITMAP *clone;
  int in_stack_00000010;
  int in_stack_00000014;
  ALLEGRO_BITMAP *in_stack_00000040;
  ALLEGRO_BITMAP *in_stack_00000048;
  ALLEGRO_BITMAP *local_8;
  
  local_8 = al_create_bitmap(in_stack_00000014,in_stack_00000010);
  if (local_8 == (ALLEGRO_BITMAP *)0x0) {
    local_8 = (ALLEGRO_BITMAP *)0x0;
  }
  else {
    _Var1 = transfer_bitmap_data(in_stack_00000048,in_stack_00000040);
    if (!_Var1) {
      al_destroy_bitmap(clone);
      local_8 = (ALLEGRO_BITMAP *)0x0;
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_BITMAP *al_clone_bitmap(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_BITMAP *clone;
   ASSERT(bitmap);

   clone = al_create_bitmap(bitmap->w, bitmap->h);
   if (!clone)
      return NULL;
   if (!transfer_bitmap_data(bitmap, clone)) {
      al_destroy_bitmap(clone);
      return NULL;
   }
   return clone;
}